

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalProcessPdu.cpp
# Opt level: O0

int __thiscall DIS::EnvironmentalProcessPdu::getMarshalledSize(EnvironmentalProcessPdu *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined1 local_38 [8];
  Environment listElement;
  unsigned_long_long idx;
  int marshalSize;
  EnvironmentalProcessPdu *this_local;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_environementalProcessID);
  iVar4 = EntityType::getMarshalledSize(&this->_environmentType);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + 5;
  listElement._padding2 = '\0';
  listElement._17_7_ = 0;
  while( true ) {
    uVar1 = listElement._16_8_;
    sVar5 = std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::size
                      (&this->_environmentRecords);
    if (sVar5 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::Environment,_std::allocator<DIS::Environment>_>::operator[]
                       (&this->_environmentRecords,listElement._16_8_);
    Environment::Environment((Environment *)local_38,pvVar6);
    iVar2 = Environment::getMarshalledSize((Environment *)local_38);
    idx._4_4_ = idx._4_4_ + iVar2;
    Environment::~Environment((Environment *)local_38);
    listElement._16_8_ = listElement._16_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int EnvironmentalProcessPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _environementalProcessID.getMarshalledSize();  // _environementalProcessID
   marshalSize = marshalSize + _environmentType.getMarshalledSize();  // _environmentType
   marshalSize = marshalSize + 1;  // _modelType
   marshalSize = marshalSize + 1;  // _environmentStatus
   marshalSize = marshalSize + 1;  // _numberOfEnvironmentRecords
   marshalSize = marshalSize + 2;  // _sequenceNumber

   for(unsigned long long idx=0; idx < _environmentRecords.size(); idx++)
   {
        Environment listElement = _environmentRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}